

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

SockaddrAny __thiscall
perfetto::base::anon_unknown_0::MakeSockAddr
          (anon_unknown_0 *this,SockFamily family,string *socket_name)

{
  ulong __n;
  sockaddr *psVar1;
  code *pcVar2;
  pointer pbVar3;
  addrinfo *__ai;
  int iVar4;
  _Head_base<0UL,_char_*,_false> _Var5;
  tuple<char_*,_std::default_delete<char[]>_> extraout_RAX;
  void *pvVar6;
  uint *puVar7;
  char *pcVar8;
  undefined8 extraout_RAX_00;
  char cVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  uint uVar11;
  pointer unaff_R15;
  SockaddrAny SVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  sockaddr_un saddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  address;
  addrinfo *addr_info;
  addrinfo *addr_info_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [32];
  char *local_b8;
  addrinfo *paStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined6 uStack_80;
  undefined2 local_7a;
  undefined6 uStack_78;
  undefined8 uStack_72;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  addrinfo *local_38;
  char *local_30;
  
  if (family == kInet6) {
    pcVar8 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"]","");
    SplitString(&local_f0,socket_name,(string *)local_d8);
    if ((char *)local_d8._0_8_ != pcVar8) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    pbVar3 = local_f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)local_d8);
      uVar10 = local_d8._0_8_;
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,(char *)uVar10,0x106ef,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(parts.size() == 2)",(ulong)uVar11,pcVar8);
LAB_002cd6a7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_d8._0_8_ = pcVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[","");
    SplitString(&local_68,pbVar3,(string *)local_d8);
    if ((char *)local_d8._0_8_ != pcVar8) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)local_d8);
      uVar10 = local_d8._0_8_;
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,(char *)uVar10,0x106f1,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(address.size() == 1)",(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    local_d8._0_8_ = pcVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
    SplitString(&local_50,
                local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1,(string *)local_d8);
    if ((char *)local_d8._0_8_ != pcVar8) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_50.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_50.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)local_d8);
      uVar10 = local_d8._0_8_;
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,(char *)uVar10,0x106f3,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(port.size() == 1)",(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    local_38 = (addrinfo *)0x0;
    local_d8._8_8_ = 0;
    local_b8 = (char *)0x0;
    paStack_b0 = (addrinfo *)0x0;
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (char *)0xa00000000;
    iVar4 = getaddrinfo(((local_68.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        *(char **)local_50.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(addrinfo *)local_d8,
                        &local_38);
    __ai = local_38;
    if (iVar4 != 0) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)&local_30);
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,local_30,0x106f8,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    if (local_38->ai_family != 10) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)&local_30);
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,local_30,0x106f9,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET6)",(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    psVar1 = local_38->ai_addr;
    uVar11 = local_38->ai_addrlen;
    pvVar6 = operator_new__((ulong)uVar11);
    *(void **)this = pvVar6;
    *(uint *)(this + 8) = uVar11;
    memcpy(pvVar6,psVar1,(ulong)uVar11);
    freeaddrinfo(__ai);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  else {
    if (family != kInet) {
      if (family != kUnix) {
        _GLOBAL__N_1::MakeSockAddr();
        if ((pointer)local_d8._0_8_ != unaff_R15) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f0);
        _Unwind_Resume(extraout_RAX_00);
      }
      uStack_78 = 0;
      uStack_72 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      local_7a = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (char *)0x0;
      paStack_b0 = (addrinfo *)0x0;
      local_d8._16_8_ = 0;
      local_d8._24_8_ = 0;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = 0;
      __n = socket_name->_M_string_length;
      if (__n < 0x6c) {
        memcpy(local_d8 + 2,(socket_name->_M_dataplus)._M_p,__n);
        cVar9 = '\0';
        if (local_d8[2] != '@') {
          cVar9 = local_d8[2];
        }
        local_d8[2] = cVar9;
        local_d8._0_2_ = 1;
        uVar11 = (int)__n + 3;
        pvVar6 = operator_new__((ulong)uVar11);
        _Var5._M_head_impl = (char *)memcpy(pvVar6,local_d8,(ulong)uVar11);
        uVar10 = extraout_RDX_01;
      }
      else {
        _Var5._M_head_impl = (char *)__errno_location();
        *(int *)_Var5._M_head_impl = 0x24;
        pvVar6 = (void *)0x0;
        uVar11 = 0;
        uVar10 = extraout_RDX;
      }
      *(void **)this = pvVar6;
      *(uint *)(this + 8) = uVar11;
      goto LAB_002cd433;
    }
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
    SplitString(&local_f0,socket_name,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)local_d8);
      uVar10 = local_d8._0_8_;
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,(char *)uVar10,0x106e1,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(parts.size() == 2)",(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._8_8_ = 0;
    local_b8 = (char *)0x0;
    paStack_b0 = (addrinfo *)0x0;
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (char *)0x200000000;
    iVar4 = getaddrinfo(((local_f0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        local_f0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                        (addrinfo *)local_d8,(addrinfo **)&local_50);
    pbVar3 = local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar4 != 0) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)&local_68);
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,
                 (char *)local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,0x106e6,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    if (*(int *)((long)local_50.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4) != 2) {
      _GLOBAL__N_1::MakeSockAddr((_GLOBAL__N_1 *)&local_68);
      puVar7 = (uint *)__errno_location();
      uVar11 = *puVar7;
      pcVar8 = strerror(uVar11);
      LogMessage(kLogError,
                 (char *)local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,0x106e7,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET)",(ulong)uVar11,pcVar8);
      goto LAB_002cd6a7;
    }
    psVar1 = *(sockaddr **)
              ((long)local_50.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x18);
    uVar11 = *(uint *)&(local_50.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
    pvVar6 = operator_new__((ulong)uVar11);
    *(void **)this = pvVar6;
    *(uint *)(this + 8) = uVar11;
    memcpy(pvVar6,psVar1,(ulong)uVar11);
    freeaddrinfo((addrinfo *)pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  _Var5._M_head_impl =
       (char *)extraout_RAX.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
  uVar10 = extraout_RDX_00;
LAB_002cd433:
  SVar12._8_8_ = uVar10;
  SVar12.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)_Var5._M_head_impl;
  return SVar12;
}

Assistant:

SockaddrAny MakeSockAddr(SockFamily family, const std::string& socket_name) {
  switch (family) {
    case SockFamily::kUnix: {
      struct sockaddr_un saddr {};
      const size_t name_len = socket_name.size();
      if (name_len >= sizeof(saddr.sun_path)) {
        errno = ENAMETOOLONG;
        return SockaddrAny();
      }
      memcpy(saddr.sun_path, socket_name.data(), name_len);
      if (saddr.sun_path[0] == '@') {
        saddr.sun_path[0] = '\0';
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
        // The MSDN blog claims that abstract (non-filesystem based) AF_UNIX
        // socket are supported, but that doesn't seem true.
        PERFETTO_ELOG(
            "Abstract AF_UNIX sockets are not supported on Windows, see "
            "https://github.com/microsoft/WSL/issues/4240");
        return SockaddrAny{};
#endif
      }
      saddr.sun_family = AF_UNIX;
      auto size = static_cast<socklen_t>(
          __builtin_offsetof(sockaddr_un, sun_path) + name_len + 1);
      PERFETTO_CHECK(static_cast<size_t>(size) <= sizeof(saddr));
      return SockaddrAny(&saddr, size);
    }
    case SockFamily::kInet: {
      auto parts = SplitString(socket_name, ":");
      PERFETTO_CHECK(parts.size() == 2);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET;
      PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
    case SockFamily::kInet6: {
      auto parts = SplitString(socket_name, "]");
      PERFETTO_CHECK(parts.size() == 2);
      auto address = SplitString(parts[0], "[");
      PERFETTO_CHECK(address.size() == 1);
      auto port = SplitString(parts[1], ":");
      PERFETTO_CHECK(port.size() == 1);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET6;
      PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET6);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
  }
  PERFETTO_CHECK(false);  // For GCC.
}